

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wallet.cpp
# Opt level: O3

ScriptPubKeyMan * __thiscall
wallet::CWallet::GetScriptPubKeyMan(CWallet *this,OutputType *type,bool internal)

{
  OutputType OVar1;
  _Base_ptr p_Var2;
  ScriptPubKeyMan *pSVar3;
  _Base_ptr p_Var4;
  undefined7 in_register_00000011;
  map<OutputType,_wallet::ScriptPubKeyMan_*,_std::less<OutputType>,_std::allocator<std::pair<const_OutputType,_wallet::ScriptPubKeyMan_*>_>_>
  *pmVar5;
  _Rb_tree_header *p_Var6;
  long in_FS_OFFSET;
  
  pmVar5 = &this->m_internal_spk_managers;
  if ((int)CONCAT71(in_register_00000011,internal) == 0) {
    pmVar5 = &this->m_external_spk_managers;
  }
  p_Var2 = (pmVar5->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var2 != (_Base_ptr)0x0) {
    p_Var6 = &(pmVar5->_M_t)._M_impl.super__Rb_tree_header;
    OVar1 = *type;
    p_Var4 = &p_Var6->_M_header;
    do {
      if ((int)OVar1 <= (int)p_Var2[1]._M_color) {
        p_Var4 = p_Var2;
      }
      p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < (int)OVar1];
    } while (p_Var2 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var4 != p_Var6) && ((int)p_Var4[1]._M_color <= (int)OVar1)) {
      pSVar3 = (ScriptPubKeyMan *)p_Var4[1]._M_parent;
      goto LAB_0016002d;
    }
  }
  pSVar3 = (ScriptPubKeyMan *)0x0;
LAB_0016002d:
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return pSVar3;
  }
  __stack_chk_fail();
}

Assistant:

ScriptPubKeyMan* CWallet::GetScriptPubKeyMan(const OutputType& type, bool internal) const
{
    const std::map<OutputType, ScriptPubKeyMan*>& spk_managers = internal ? m_internal_spk_managers : m_external_spk_managers;
    std::map<OutputType, ScriptPubKeyMan*>::const_iterator it = spk_managers.find(type);
    if (it == spk_managers.end()) {
        return nullptr;
    }
    return it->second;
}